

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O1

bool QDnsLookup::isProtocolSupported(Protocol protocol)

{
  bool bVar1;
  undefined3 in_register_00000039;
  
  if (CONCAT31(in_register_00000039,protocol) == 0) {
    return true;
  }
  if (CONCAT31(in_register_00000039,protocol) != 1) {
    return false;
  }
  bVar1 = QSslSocket::supportsSsl();
  return bVar1;
}

Assistant:

bool QDnsLookup::isProtocolSupported(Protocol protocol)
{
#if QT_CONFIG(libresolv) || defined(Q_OS_WIN)
    switch (protocol) {
    case QDnsLookup::Standard:
        return true;
    case QDnsLookup::DnsOverTls:
#  if QT_CONFIG(ssl)
        if (QSslSocket::supportsSsl())
            return true;
#  endif
        return false;
    }
#else
    Q_UNUSED(protocol)
#endif
    return false;
}